

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O2

Vector<float,_16> *
deqp::gles3::Performance::combineVec4ToVec16
          (Vector<float,_16> *__return_storage_ptr__,Vec4 *a0,Vec4 *a1,Vec4 *a2,Vec4 *a3)

{
  int vecNdx;
  long lVar1;
  float *pfVar2;
  Vec4 *pVVar3;
  long lVar4;
  
  tcu::Vector<float,_16>::Vector(__return_storage_ptr__);
  lVar1 = 0;
  pfVar2 = __return_storage_ptr__->m_data;
  for (; lVar1 != 4; lVar1 = lVar1 + 1) {
    pVVar3 = a0;
    if ((((int)lVar1 != 0) && (pVVar3 = a1, (int)lVar1 != 1)) && (pVVar3 = a3, lVar1 == 2)) {
      pVVar3 = a2;
    }
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      pfVar2[lVar4] = pVVar3->m_data[lVar4];
    }
    pfVar2 = pfVar2 + 4;
  }
  return __return_storage_ptr__;
}

Assistant:

static tcu::Vector<float, 16> combineVec4ToVec16 (const Vec4& a0, const Vec4& a1, const Vec4& a2, const Vec4& a3)
{
	tcu::Vector<float, 16> result;

	for (int vecNdx = 0; vecNdx < 4; vecNdx++)
	{
		const Vec4& srcVec = vecNdx == 0 ? a0 : vecNdx == 1 ? a1 : vecNdx == 2 ? a2 : a3;
		for (int i = 0; i < 4; i++)
			result[vecNdx*4 + i] = srcVec[i];
	}

	return result;
}